

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O0

int link_send_disposition(LINK_HANDLE link,delivery_number message_id,AMQP_VALUE delivery_state)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l;
  int result;
  AMQP_VALUE delivery_state_local;
  delivery_number message_id_local;
  LINK_HANDLE link_local;
  
  if (delivery_state == (AMQP_VALUE)0x0) {
    l._4_4_ = 0;
  }
  else {
    l._4_4_ = send_disposition(link,message_id,delivery_state);
    if (l._4_4_ != 0) {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                  ,"link_send_disposition",0x63b,1,"Cannot send disposition frame");
      }
      l._4_4_ = 0x63c;
    }
  }
  return l._4_4_;
}

Assistant:

int link_send_disposition(LINK_HANDLE link, delivery_number message_id, AMQP_VALUE delivery_state)
{
    int result;

    if (delivery_state == NULL)
    {
        result = 0;
    }
    else
    {
        result = send_disposition(link, message_id, delivery_state);
        if (result != 0)
        {
            LogError("Cannot send disposition frame");
            result = MU_FAILURE;
        }
    }

    return result;
}